

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O2

void __thiscall libtorrent::aux::chained_buffer::clear(chained_buffer *this)

{
  _Elt_pointer pbVar1;
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  *__range2;
  _Elt_pointer pbVar2;
  buffer_t *b;
  _Elt_pointer pbVar3;
  _Map_pointer ppbVar4;
  
  pbVar3 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar2 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppbVar4 = (this->m_vec).
            super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pbVar3 != pbVar1) {
    (*pbVar3->destruct_holder)(&pbVar3->holder);
    pbVar3 = pbVar3 + 1;
    if (pbVar3 == pbVar2) {
      pbVar3 = ppbVar4[1];
      ppbVar4 = ppbVar4 + 1;
      pbVar2 = pbVar3 + 8;
    }
  }
  this->m_bytes = 0;
  this->m_capacity = 0;
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::clear(&this->m_vec);
  return;
}

Assistant:

void chained_buffer::clear()
	{
		TORRENT_ASSERT(!m_destructed);
		for (auto& b : m_vec)
			b.destruct_holder(static_cast<void*>(&b.holder));
		m_bytes = 0;
		m_capacity = 0;
		m_vec.clear();
	}